

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O2

ssize_t __thiscall
wabt::intrusive_list<wabt::Expr>::splice
          (intrusive_list<wabt::Expr> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  iterator pos;
  iterator pos_00;
  iterator iVar2;
  undefined1 in_stack_0000000c [12];
  undefined1 local_58 [8];
  iterator first_local;
  Expr *local_38;
  
  pos_00.list_._4_4_ = in_register_00000034;
  pos_00.list_._0_4_ = __fdin;
  first_local.node_ = (Expr *)CONCAT44(in_register_0000000c,__fdout);
  local_58 = (undefined1  [8])__offout;
  first_local.list_ = (intrusive_list<wabt::Expr> *)__len;
  while( true ) {
    iVar2._4_12_ = in_stack_0000000c;
    iVar2.list_._0_4_ = __flags;
    bVar1 = iterator::operator!=((iterator *)local_58,iVar2);
    if (!bVar1) break;
    iVar2 = iterator::operator++((iterator *)local_58,0);
    pos.node_ = (Expr *)iVar2.list_;
    pos.list_ = (intrusive_list<wabt::Expr> *)first_local.node_;
    extract((intrusive_list<wabt::Expr> *)&local_38,pos);
    pos_00.node_ = (Expr *)__offin;
    insert(this,pos_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38);
    if (local_38 != (Expr *)0x0) {
      (*local_38->_vptr_Expr[1])();
    }
    local_38 = (Expr *)0x0;
  }
  return CONCAT71(extraout_var,bVar1);
}

Assistant:

inline void intrusive_list<T>::splice(iterator pos,
                                      intrusive_list& other,
                                      iterator first,
                                      iterator last) {
  while (first != last)
    insert(pos, other.extract(first++));
}